

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_reduce_1phase_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  bsc_pid_t local_50;
  bsc_step_t local_4c;
  int local_48;
  bsc_step_t finished;
  bsc_size_t i;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t n_local;
  bsc_coll_params_t *params_local;
  bsc_group_t group_local;
  bsp_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    local_50 = bsp_nprocs();
  }
  else {
    local_50 = *group;
  }
  local_4c = depends;
  for (local_48 = 0; local_48 < n; local_48 = local_48 + 1) {
    local_4c = bsc_reduce_qtree_single
                         (depends,root,group,params[local_48].src,params[local_48].dst,
                          params[local_48].tmp,params[local_48].reducer,params[local_48].zero,
                          params[local_48].nmemb,params[local_48].size,local_50);
  }
  return local_4c;
}

Assistant:

bsc_step_t bsc_reduce_1phase_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_reduce_qtree_single( depends, root, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, P );
    }

    return finished;
}